

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  SnapGeneratorVirtualScriptFunctionInfo *pSVar2;
  FunctionBody *proxy;
  GeneratorVirtualScriptFunction *pGVar3;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorVirtualScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)35>
                     (snpObject);
  proxy = InflateMap::LookupFunctionBody(inflator,(pSVar2->super_SnapScriptFunctionInfo).BodyRefId);
  pGVar3 = Js::JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,(FunctionProxy *)proxy);
  return (RecyclableObject *)pGVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext *ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapGeneratorVirtualScriptFunctionInfo* sgvsf = SnapObjectGetAddtlInfoAs<SnapGeneratorVirtualScriptFunctionInfo *, SnapObjectType::SnapGeneratorVirtualScriptFunction>(snpObject);
            Js::FunctionBody* fbody = inflator->LookupFunctionBody(sgvsf->BodyRefId);
            return ctx->GetLibrary()->CreateGeneratorVirtualScriptFunction(fbody);
        }